

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_CheckIndex_Test::ExprTest_CheckIndex_Test(ExprTest_CheckIndex_Test *this)

{
  undefined8 *in_RDI;
  ExprTest *in_stack_00000040;
  
  ExprTest::ExprTest(in_stack_00000040);
  *in_RDI = &PTR__ExprTest_CheckIndex_Test_002275d0;
  return;
}

Assistant:

TEST_F(ExprTest, CheckIndex) {
  mp::internal::CheckIndex(0, 3);
  mp::internal::CheckIndex(2, 3);
  EXPECT_ASSERT(mp::internal::CheckIndex(-10, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(-1, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(3, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(10, 3), "invalid index");
}